

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_transaction.cpp
# Opt level: O3

void __thiscall
TransactionApi_FundRawTransaction_LimitAmountValue_Test::TestBody
          (TransactionApi_FundRawTransaction_LimitAmountValue_Test *this)

{
  pointer puVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar2;
  bool bVar3;
  undefined4 uVar4;
  int iVar5;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  char *pcVar6;
  long lVar7;
  initializer_list<cfd::UtxoData> __l;
  AssertionResult gtest_ar_2;
  TransactionApi api;
  uint32_t minimum_fee;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> selected_txin_utxos;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  Amount estimate_fee;
  AddressFactory factory;
  Amount target_value;
  Amount fee;
  TransactionContext txc;
  CoinSelectionOption option;
  Address address;
  AssertionResult gtest_ar;
  TransactionController tx_obj;
  Address address3;
  Address address2;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  undefined4 in_stack_ffffffffffffdae4;
  AssertHelper local_2508;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2500;
  undefined1 local_24f8 [16];
  AssertHelper local_24e8 [4];
  vector local_24c1;
  code *local_24c0;
  ByteData local_24b8;
  undefined1 *local_24a0 [2];
  undefined1 local_2490 [16];
  Pubkey local_2480;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_2468;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_2448;
  Amount local_2430 [20];
  SigHashType local_241c [12];
  SigHashType local_2410 [12];
  SigHashType local_2404 [12];
  AddressFactory local_23f8;
  Amount local_23d0 [16];
  Amount local_23c0 [16];
  OutPoint local_23b0 [4];
  undefined8 local_22f8;
  undefined1 local_22f0;
  undefined **local_22c0;
  void *local_22b8;
  undefined1 **local_2290 [2];
  undefined1 *local_2280 [2];
  undefined1 local_2270 [16];
  void *local_2260;
  void *local_2248;
  void *local_2230;
  code *local_2218 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_21a0;
  Script local_2188;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2148;
  undefined1 local_2118 [72];
  void *local_20d0;
  void *local_20b8;
  code *local_20a0 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_2028;
  Script local_2010;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1fd0 [19];
  UtxoData local_1c28 [1264];
  UtxoData local_1738 [1272];
  undefined **local_1240 [2];
  Transaction local_1230 [64];
  Address local_11f0 [16];
  undefined1 *local_11e0;
  undefined1 local_11d0 [16];
  void *local_11c0;
  void *local_11a8;
  void *local_1190;
  code *local_1178 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1100;
  Script local_10e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_10a8;
  Address local_1078 [16];
  undefined1 *local_1068;
  undefined1 local_1058 [16];
  void *local_1048;
  void *local_1030;
  void *local_1018;
  code *local_1000 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_f88;
  Script local_f70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f30;
  undefined1 *local_f00 [2];
  undefined1 local_ef0 [24];
  Txid local_ed8;
  uint local_eb8;
  Script local_eb0 [2];
  Address local_e40 [376];
  undefined1 local_cc8 [8];
  char *local_cc0;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_ca8;
  undefined1 local_ca0;
  undefined4 local_c98;
  undefined8 local_c90;
  undefined1 *local_a10 [2];
  undefined1 local_a00 [24];
  Txid local_9e8;
  uint local_9c8;
  Script local_9c0 [2];
  Address local_950 [376];
  undefined1 local_7d8 [8];
  char *local_7d0;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_7b8;
  undefined1 local_7b0;
  undefined4 local_7a8;
  undefined8 local_7a0;
  undefined8 local_520 [5];
  Txid local_4f8;
  uint local_4d8;
  Script local_4d0 [2];
  Address local_460 [376];
  undefined1 local_2e8 [8];
  char *local_2e0;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  undefined1 local_2c0;
  undefined4 local_2b8;
  undefined8 local_2b0;
  
  cfd::AddressFactory::AddressFactory(&local_23f8,kRegtest);
  cfd::UtxoData::UtxoData((UtxoData *)local_520);
  local_520[0] = 0;
  local_2b0 = 0;
  local_a10[0] = local_a00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a10,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             "");
  cfd::core::Txid::Txid((Txid *)local_2118,(string *)local_a10);
  cfd::core::Txid::operator=(&local_4f8,(Txid *)local_2118);
  local_2118._0_8_ = &PTR__Txid_002dbe60;
  if ((pointer)local_2118._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2118._8_8_);
  }
  if (local_a10[0] != local_a00) {
    operator_delete(local_a10[0]);
  }
  local_4d8 = 0;
  local_a10[0] = local_a00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a10,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac","");
  cfd::core::Script::Script((Script *)local_2118,(string *)local_a10);
  cfd::core::Script::operator=(local_4d0,(Script *)local_2118);
  cfd::core::Script::~Script((Script *)local_2118);
  if (local_a10[0] != local_a00) {
    operator_delete(local_a10[0]);
  }
  local_a10[0] = local_a00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a10,"n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW","");
  cfd::AddressFactory::GetAddress((string *)local_2118);
  cfd::core::Address::operator=(local_460,(Address *)local_2118);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1fd0);
  cfd::core::Script::~Script(&local_2010);
  local_24c0 = cfd::core::Psbt::CheckTxInIndex;
  local_20a0[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_2028)
  ;
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_20a0);
  if (local_20b8 != (void *)0x0) {
    operator_delete(local_20b8);
  }
  if (local_20d0 != (void *)0x0) {
    operator_delete(local_20d0);
  }
  if ((void *)local_2118._48_8_ != (void *)0x0) {
    operator_delete((void *)local_2118._48_8_);
  }
  puVar1 = local_2118 + 0x20;
  if ((pointer)local_2118._16_8_ != puVar1) {
    operator_delete((void *)local_2118._16_8_);
  }
  if (local_a10[0] != local_a00) {
    operator_delete(local_a10[0]);
  }
  std::__cxx11::string::_M_replace((ulong)local_2e8,0,local_2e0,0x286d3c);
  cfd::core::Amount::Amount((Amount *)local_2118,50000000000000);
  local_2c0 = local_2118[8];
  local_2c8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_2118._0_8_;
  local_2b8 = 2;
  cfd::UtxoData::UtxoData((UtxoData *)local_a10);
  local_a10[0] = (undefined1 *)0x0;
  local_7a0 = 0;
  local_f00[0] = local_ef0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f00,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",
             "");
  cfd::core::Txid::Txid((Txid *)local_2118,(string *)local_f00);
  cfd::core::Txid::operator=(&local_9e8,(Txid *)local_2118);
  local_2118._0_8_ = &PTR__Txid_002dbe60;
  if ((pointer)local_2118._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2118._8_8_);
  }
  if (local_f00[0] != local_ef0) {
    operator_delete(local_f00[0]);
  }
  local_9c8 = 0;
  local_f00[0] = local_ef0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f00,"a9145d54db96a28f844a744e393fcd699d6f825b284187","");
  cfd::core::Script::Script((Script *)local_2118,(string *)local_f00);
  cfd::core::Script::operator=(local_9c0,(Script *)local_2118);
  cfd::core::Script::~Script((Script *)local_2118);
  if (local_f00[0] != local_ef0) {
    operator_delete(local_f00[0]);
  }
  local_f00[0] = local_ef0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f00,"2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16","");
  cfd::AddressFactory::GetAddress((string *)local_2118);
  cfd::core::Address::operator=(local_950,(Address *)local_2118);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1fd0);
  cfd::core::Script::~Script(&local_2010);
  local_20a0[0] = local_24c0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_2028)
  ;
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_20a0);
  if (local_20b8 != (void *)0x0) {
    operator_delete(local_20b8);
  }
  if (local_20d0 != (void *)0x0) {
    operator_delete(local_20d0);
  }
  if ((void *)local_2118._48_8_ != (void *)0x0) {
    operator_delete((void *)local_2118._48_8_);
  }
  if ((pointer)local_2118._16_8_ != puVar1) {
    operator_delete((void *)local_2118._16_8_);
  }
  if (local_f00[0] != local_ef0) {
    operator_delete(local_f00[0]);
  }
  std::__cxx11::string::_M_replace((ulong)local_7d8,0,local_7d0,0x24c1e7);
  cfd::core::Amount::Amount((Amount *)local_2118,2000000000000000);
  local_7b0 = local_2118[8];
  local_7b8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_2118._0_8_;
  local_7a8 = 6;
  cfd::UtxoData::UtxoData((UtxoData *)local_f00);
  local_f00[0] = (undefined1 *)0x0;
  local_c90 = 0;
  local_2290[0] = local_2280;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2290,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_2118,(string *)local_2290);
  cfd::core::Txid::operator=(&local_ed8,(Txid *)local_2118);
  local_2118._0_8_ = &PTR__Txid_002dbe60;
  if ((pointer)local_2118._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2118._8_8_);
  }
  if (local_2290[0] != local_2280) {
    operator_delete(local_2290[0]);
  }
  local_eb8 = 1;
  local_2290[0] = local_2280;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2290,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4","");
  cfd::core::Script::Script((Script *)local_2118,(string *)local_2290);
  cfd::core::Script::operator=(local_eb0,(Script *)local_2118);
  cfd::core::Script::~Script((Script *)local_2118);
  if (local_2290[0] != local_2280) {
    operator_delete(local_2290[0]);
  }
  local_2290[0] = local_2280;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2290,"bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w","");
  cfd::AddressFactory::GetAddress((string *)local_2118);
  cfd::core::Address::operator=(local_e40,(Address *)local_2118);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1fd0);
  cfd::core::Script::~Script(&local_2010);
  local_20a0[0] = local_24c0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_2028)
  ;
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_20a0);
  if (local_20b8 != (void *)0x0) {
    operator_delete(local_20b8);
  }
  if (local_20d0 != (void *)0x0) {
    operator_delete(local_20d0);
  }
  if ((void *)local_2118._48_8_ != (void *)0x0) {
    operator_delete((void *)local_2118._48_8_);
  }
  if ((pointer)local_2118._16_8_ != puVar1) {
    operator_delete((void *)local_2118._16_8_);
  }
  if (local_2290[0] != local_2280) {
    operator_delete(local_2290[0]);
  }
  std::__cxx11::string::_M_replace((ulong)local_cc8,0,local_cc0,0x286d3b);
  cfd::core::Amount::Amount((Amount *)local_2118,50000000000000);
  sVar2.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_2118 + 0x10);
  local_ca0 = local_2118[8];
  local_ca8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_2118._0_8_;
  local_c98 = 4;
  local_2118._0_8_ = sVar2.ptr_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2118,"mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo","");
  cfd::core::Address::Address((Address *)local_2290,(string *)local_2118);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2118._0_8_ !=
      sVar2.ptr_) {
    operator_delete((void *)local_2118._0_8_);
  }
  local_2118._0_8_ = sVar2.ptr_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2118,"bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu","");
  cfd::core::Address::Address(local_1078,(string *)local_2118);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2118._0_8_ !=
      sVar2.ptr_) {
    operator_delete((void *)local_2118._0_8_);
  }
  local_2118._0_8_ = sVar2.ptr_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2118,"bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w","");
  cfd::core::Address::Address(local_11f0,(string *)local_2118);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2118._0_8_ !=
      sVar2.ptr_) {
    operator_delete((void *)local_2118._0_8_);
  }
  cfd::core::Amount::Amount(local_23c0,10000);
  cfd::TransactionContext::TransactionContext((TransactionContext *)local_23b0,2,0);
  local_22f8 = cfd::core::operator+((Amount *)&local_2c8,(Amount *)&local_ca8);
  local_22f0 = extraout_DL;
  local_2118._0_8_ = cfd::core::operator-((Amount *)&local_22f8,local_23c0);
  local_2118[8] = extraout_DL_00;
  cfd::TransactionContext::AddTxOut((Address *)local_23b0,(Amount *)local_2290);
  cfd::TransactionContext::AddTxOut((Address *)local_23b0,(Amount *)local_1078);
  cfd::UtxoData::UtxoData((UtxoData *)local_2118,(UtxoData *)local_520);
  cfd::UtxoData::UtxoData(local_1c28,(UtxoData *)local_a10);
  cfd::UtxoData::UtxoData(local_1738,(UtxoData *)local_f00);
  __l._M_len = 3;
  __l._M_array = (iterator)local_2118;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&local_2448,__l,(allocator_type *)&local_22f8);
  lVar7 = 0x9e0;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(local_2118 + lVar7));
    lVar7 = lVar7 + -0x4f0;
  } while (lVar7 != -0x4f0);
  cfd::CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)&local_22f8);
  local_2468.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2468.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2468.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Amount::Amount(local_23d0);
  cfd::core::Amount::Amount(local_2430);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  cfd::core::Address::GetAddress_abi_cxx11_();
  cfd::api::TransactionApi::FundRawTransaction
            ((string *)local_1240,&local_24c1,(Amount *)local_2118,(vector *)&local_2448,
             (string *)local_23d0,20.0,(Amount *)&local_2468,(UtxoFilter *)&local_2508,
             (CoinSelectionOption *)local_2430,(vector *)0x0,
             (NetType)(CoinSelectionOption *)&local_22f8,(vector *)0x0,
             (Amount *)CONCAT44(in_stack_ffffffffffffdae4,2));
  if (local_2508.data_ != (AssertHelperData *)local_24f8) {
    operator_delete(local_2508.data_);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2118._0_8_ !=
      sVar2.ptr_) {
    operator_delete((void *)local_2118._0_8_);
  }
  local_2508.data_ = (AssertHelperData *)cfd::core::Amount::GetSatoshiValue();
  local_24e8[0].data_._0_4_ = 0x20a8;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_2118,"estimate_fee.GetSatoshiValue()","8360",(long *)&local_2508,
             (int *)local_24e8);
  if (local_2118[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_2508);
    if ((pointer)local_2118._8_8_ == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_2118._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_24e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x163,pcVar6);
    testing::internal::AssertHelper::operator=(local_24e8,(Message *)&local_2508);
    testing::internal::AssertHelper::~AssertHelper(local_24e8);
    if (local_2508.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2508.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_2508.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2118 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  cfd::TransactionContext::TransactionContext
            ((TransactionContext *)local_2118,(string *)&local_2508);
  cfd::TransactionContext::operator=
            ((TransactionContext *)local_23b0,(TransactionContext *)local_2118);
  cfd::TransactionContext::~TransactionContext((TransactionContext *)local_2118);
  if (local_2508.data_ != (AssertHelperData *)local_24f8) {
    operator_delete(local_2508.data_);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::TransactionContext::CollectInputUtxo((vector *)local_23b0);
    }
  }
  else {
    testing::Message::Message((Message *)local_2118);
    testing::internal::AssertHelper::AssertHelper
              (&local_2508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x166,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2508,(Message *)local_2118);
    testing::internal::AssertHelper::~AssertHelper(&local_2508);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2118._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_2118._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_2118._0_8_ + 8))();
      }
    }
  }
  cfd::core::ByteData::ByteData(&local_24b8);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2118,&local_4f8,local_4d8);
      local_2508.data_ = (AssertHelperData *)local_24f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2508,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_2480,(string *)&local_2508);
      local_24a0[0] = local_2490;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_24a0,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif((string *)local_24e8,(NetType)local_24a0,true);
      cfd::core::SigHashType::SigHashType(local_2404);
      cfd::TransactionContext::SignWithKey
                (local_23b0,local_2118,&local_2480,local_24e8,local_2404,1,0,0);
      if (local_24e8[0].data_ != (AssertHelperData *)0x0) {
        operator_delete(local_24e8[0].data_);
      }
      if (local_24a0[0] != local_2490) {
        operator_delete(local_24a0[0]);
      }
      if (local_2480.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2480.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_2508.data_ != (AssertHelperData *)local_24f8) {
        operator_delete(local_2508.data_);
      }
      local_2118._0_8_ = &PTR__Txid_002dbe60;
      if ((pointer)local_2118._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_2118._8_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2118);
    testing::internal::AssertHelper::AssertHelper
              (&local_2508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x16d,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2508,(Message *)local_2118);
    testing::internal::AssertHelper::~AssertHelper(&local_2508);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2118._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_2118._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_2118._0_8_ + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2118,&local_4f8,local_4d8);
      cfd::TransactionContext::Verify(local_23b0);
      local_2118._0_8_ = &PTR__Txid_002dbe60;
      if ((pointer)local_2118._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_2118._8_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2118);
    testing::internal::AssertHelper::AssertHelper
              (&local_2508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x16e,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2508,(Message *)local_2118);
    testing::internal::AssertHelper::~AssertHelper(&local_2508);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2118._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_2118._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_2118._0_8_ + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    cfd::TransactionContext::Finalize();
    puVar1 = local_24b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_24b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_2118._0_8_;
    local_24b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_2118._8_8_;
    local_24b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_2118._16_8_;
    local_2118._0_8_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_2118._8_8_ = (pointer)0x0;
    local_2118._16_8_ = (pointer)0x0;
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar1 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(puVar1);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_2118._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete((void *)local_2118._0_8_);
      }
    }
  }
  testing::Message::Message((Message *)local_2118);
  testing::internal::AssertHelper::AssertHelper
            (&local_2508,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
             ,0x16f,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_2508,(Message *)local_2118);
  testing::internal::AssertHelper::~AssertHelper(&local_2508);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2118._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2118._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(_func_int **)local_2118._0_8_ + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2118,&local_9e8,local_9c8);
      local_2508.data_ = (AssertHelperData *)local_24f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2508,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27","");
      cfd::core::Pubkey::Pubkey(&local_2480,(string *)&local_2508);
      local_24a0[0] = local_2490;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_24a0,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP","");
      cfd::core::Privkey::FromWif((string *)local_24e8,(NetType)local_24a0,true);
      cfd::core::SigHashType::SigHashType(local_2410);
      cfd::TransactionContext::SignWithKey
                (local_23b0,local_2118,&local_2480,local_24e8,local_2410,1,0,0);
      if (local_24e8[0].data_ != (AssertHelperData *)0x0) {
        operator_delete(local_24e8[0].data_);
      }
      if (local_24a0[0] != local_2490) {
        operator_delete(local_24a0[0]);
      }
      if (local_2480.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2480.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_2508.data_ != (AssertHelperData *)local_24f8) {
        operator_delete(local_2508.data_);
      }
      local_2118._0_8_ = &PTR__Txid_002dbe60;
      if ((pointer)local_2118._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_2118._8_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2118);
    testing::internal::AssertHelper::AssertHelper
              (&local_2508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x174,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2508,(Message *)local_2118);
    testing::internal::AssertHelper::~AssertHelper(&local_2508);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2118._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_2118._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_2118._0_8_ + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2118,&local_9e8,local_9c8);
      cfd::TransactionContext::Verify(local_23b0);
      local_2118._0_8_ = &PTR__Txid_002dbe60;
      if ((pointer)local_2118._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_2118._8_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2118);
    testing::internal::AssertHelper::AssertHelper
              (&local_2508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x175,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2508,(Message *)local_2118);
    testing::internal::AssertHelper::~AssertHelper(&local_2508);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2118._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_2118._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_2118._0_8_ + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    cfd::TransactionContext::Finalize();
    puVar1 = local_24b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_24b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_2118._0_8_;
    local_24b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_2118._8_8_;
    local_24b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_2118._16_8_;
    local_2118._0_8_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_2118._8_8_ = (pointer)0x0;
    local_2118._16_8_ = (pointer)0x0;
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar1 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(puVar1);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_2118._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete((void *)local_2118._0_8_);
      }
    }
  }
  testing::Message::Message((Message *)local_2118);
  testing::internal::AssertHelper::AssertHelper
            (&local_2508,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
             ,0x176,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_2508,(Message *)local_2118);
  testing::internal::AssertHelper::~AssertHelper(&local_2508);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2118._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2118._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(_func_int **)local_2118._0_8_ + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2118,&local_ed8,local_eb8);
      local_2508.data_ = (AssertHelperData *)local_24f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2508,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_2480,(string *)&local_2508);
      local_24a0[0] = local_2490;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_24a0,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif((string *)local_24e8,(NetType)local_24a0,true);
      cfd::core::SigHashType::SigHashType(local_241c);
      cfd::TransactionContext::SignWithKey
                (local_23b0,local_2118,&local_2480,local_24e8,local_241c,1,0,0);
      if (local_24e8[0].data_ != (AssertHelperData *)0x0) {
        operator_delete(local_24e8[0].data_);
      }
      if (local_24a0[0] != local_2490) {
        operator_delete(local_24a0[0]);
      }
      if (local_2480.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2480.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_2508.data_ != (AssertHelperData *)local_24f8) {
        operator_delete(local_2508.data_);
      }
      local_2118._0_8_ = &PTR__Txid_002dbe60;
      if ((pointer)local_2118._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_2118._8_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2118);
    testing::internal::AssertHelper::AssertHelper
              (&local_2508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x17b,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2508,(Message *)local_2118);
    testing::internal::AssertHelper::~AssertHelper(&local_2508);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2118._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_2118._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_2118._0_8_ + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2118,&local_ed8,local_eb8);
      cfd::TransactionContext::Verify(local_23b0);
      local_2118._0_8_ = &PTR__Txid_002dbe60;
      if ((pointer)local_2118._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_2118._8_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2118);
    testing::internal::AssertHelper::AssertHelper
              (&local_2508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x17c,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2508,(Message *)local_2118);
    testing::internal::AssertHelper::~AssertHelper(&local_2508);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2118._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_2118._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_2118._0_8_ + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::TransactionContext::Finalize();
      puVar1 = local_24b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_24b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_2118._0_8_;
      local_24b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_2118._8_8_;
      local_24b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_2118._16_8_;
      local_2118._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_2118._8_8_ = (pointer)0x0;
      local_2118._16_8_ = (pointer)0x0;
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar1 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(puVar1);
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_2118._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete((void *)local_2118._0_8_);
        }
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2118);
    testing::internal::AssertHelper::AssertHelper
              (&local_2508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x17e,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_2508,(Message *)local_2118);
    testing::internal::AssertHelper::~AssertHelper(&local_2508);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2118._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_2118._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_2118._0_8_ + 8))();
      }
    }
  }
  local_2508.data_ = (AssertHelperData *)cfd::TransactionContext::GetFeeAmount();
  local_2500.ptr_._0_1_ = extraout_DL_01;
  local_24e8[0].data_ = (AssertHelperData *)cfd::core::Amount::GetSatoshiValue();
  local_24a0[0] = (undefined1 *)cfd::core::Amount::GetSatoshiValue();
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_2118,"txc.GetFeeAmount().GetSatoshiValue()",
             "estimate_fee.GetSatoshiValue()",(long *)local_24e8,(long *)local_24a0);
  if (local_2118[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_2508);
    if ((pointer)local_2118._8_8_ == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_2118._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_24e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x17f,pcVar6);
    testing::internal::AssertHelper::operator=(local_24e8,(Message *)&local_2508);
    testing::internal::AssertHelper::~AssertHelper(local_24e8);
    if (local_2508.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2508.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_2508.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2118 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2508,"tx.GetHex().c_str()",
             "\"02000000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a473044022029f4ce58206fe107b1dd6cbaf3246391a55cdd639cce10fdf545a8c131e17ebf022022b47d656c8666b188c6b16f9e10f6718bbbd420c390fe7a039f9c4323596d1c01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff03f0187a10f35a00001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac00008d49fd1a070016001445663e592ff613587f0fdd6e74034c5239710dca6806000000000000160014f330ed8383f8afdc977dd88600eb8ff120ba15e40247304402204f83d997acfadec69e45d1719794850ebc3f5bee41057aeefefed8e678e0ed6802206c7653837d7b70343b0dac4f47170b261885c4fcad35b346d0da02d0cc342b7b01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270247304402206089cce85471b83b7afafc4c8363ca10124d831914a27817fa77e27e5a5f5b2e02200cf2c185a1caa93f84ecd25cc4b67cbf04ba3857ca4310688245a53491b9e6f601210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000\""
             ,(char *)local_2118._0_8_,
             "02000000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a473044022029f4ce58206fe107b1dd6cbaf3246391a55cdd639cce10fdf545a8c131e17ebf022022b47d656c8666b188c6b16f9e10f6718bbbd420c390fe7a039f9c4323596d1c01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff03f0187a10f35a00001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac00008d49fd1a070016001445663e592ff613587f0fdd6e74034c5239710dca6806000000000000160014f330ed8383f8afdc977dd88600eb8ff120ba15e40247304402204f83d997acfadec69e45d1719794850ebc3f5bee41057aeefefed8e678e0ed6802206c7653837d7b70343b0dac4f47170b261885c4fcad35b346d0da02d0cc342b7b01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270247304402206089cce85471b83b7afafc4c8363ca10124d831914a27817fa77e27e5a5f5b2e02200cf2c185a1caa93f84ecd25cc4b67cbf04ba3857ca4310688245a53491b9e6f601210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000"
            );
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2118._0_8_ !=
      sVar2.ptr_) {
    operator_delete((void *)local_2118._0_8_);
  }
  if (local_2508.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_2118);
    if ((undefined8 *)CONCAT71(local_2500.ptr_._1_7_,local_2500.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT71(local_2500.ptr_._1_7_,local_2500.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (local_24e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x180,pcVar6);
    testing::internal::AssertHelper::operator=(local_24e8,(Message *)local_2118);
    testing::internal::AssertHelper::~AssertHelper(local_24e8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2118._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_2118._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_2118._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2500,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar4 = cfd::core::Transaction::GetVsize();
  local_2508.data_._0_4_ = uVar4;
  local_24e8[0].data_._0_4_ = 0x19d;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_2118,"txc.GetVsize()","413",(uint *)&local_2508,(int *)local_24e8);
  if (local_2118[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_2508);
    if ((pointer)local_2118._8_8_ == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_2118._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_24e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x181,pcVar6);
    testing::internal::AssertHelper::operator=(local_24e8,(Message *)&local_2508);
    testing::internal::AssertHelper::~AssertHelper(local_24e8);
    if (local_2508.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2508.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_2508.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2118 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  iVar5 = cfd::core::Transaction::GetVsize();
  local_24a0[0] = (undefined1 *)CONCAT44(local_24a0[0]._4_4_,iVar5 * 0x14);
  local_2508.data_._0_4_ = 0x2044;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_2118,"minimum_fee","8260",(uint *)local_24a0,(int *)&local_2508);
  if (local_2118[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_2508);
    if ((pointer)local_2118._8_8_ == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_2118._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_24e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x184,pcVar6);
    testing::internal::AssertHelper::operator=(local_24e8,(Message *)&local_2508);
    testing::internal::AssertHelper::~AssertHelper(local_24e8);
    if (local_2508.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2508.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_2508.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2118 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_24b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_24b8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_1240[0] = &PTR__TransactionController_002dd530;
  cfd::core::Transaction::~Transaction(local_1230);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_2468);
  local_22c0 = &PTR__ConfidentialAssetId_002dc170;
  if (local_22b8 != (void *)0x0) {
    operator_delete(local_22b8);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_2448);
  cfd::TransactionContext::~TransactionContext((TransactionContext *)local_23b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_10a8);
  cfd::core::Script::~Script(&local_10e8);
  local_1178[0] = local_24c0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1100)
  ;
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_1178);
  if (local_1190 != (void *)0x0) {
    operator_delete(local_1190);
  }
  if (local_11a8 != (void *)0x0) {
    operator_delete(local_11a8);
  }
  if (local_11c0 != (void *)0x0) {
    operator_delete(local_11c0);
  }
  if (local_11e0 != local_11d0) {
    operator_delete(local_11e0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_f30);
  cfd::core::Script::~Script(&local_f70);
  local_1000[0] = local_24c0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_f88);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_1000);
  if (local_1018 != (void *)0x0) {
    operator_delete(local_1018);
  }
  if (local_1030 != (void *)0x0) {
    operator_delete(local_1030);
  }
  if (local_1048 != (void *)0x0) {
    operator_delete(local_1048);
  }
  if (local_1068 != local_1058) {
    operator_delete(local_1068);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_2148);
  cfd::core::Script::~Script(&local_2188);
  local_2218[0] = local_24c0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_21a0)
  ;
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_2218);
  if (local_2230 != (void *)0x0) {
    operator_delete(local_2230);
  }
  if (local_2248 != (void *)0x0) {
    operator_delete(local_2248);
  }
  if (local_2260 != (void *)0x0) {
    operator_delete(local_2260);
  }
  if (local_2280[0] != local_2270) {
    operator_delete(local_2280[0]);
  }
  cfd::UtxoData::~UtxoData((UtxoData *)local_f00);
  cfd::UtxoData::~UtxoData((UtxoData *)local_a10);
  cfd::UtxoData::~UtxoData((UtxoData *)local_520);
  local_23f8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_002d9fd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_23f8.prefix_list_);
  return;
}

Assistant:

TEST(TransactionApi, FundRawTransaction_LimitAmountValue) {
  AddressFactory factory(NetType::kRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{50000000000000});
  utxo1.address_type = AddressType::kP2pkhAddress;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{2000000000000000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{50000000000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address("mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2("bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu");
  Address address3("bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w");

  Amount fee(int64_t{10000});
  TransactionContext txc(2, 0);
  txc.AddTxOut(address, utxo1.amount + utxo3.amount - fee);
  txc.AddTxOut(address2, utxo2.amount);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  double effective_fee_rate = 20.0;
  CoinSelectionOption option;
  std::vector<UtxoData> selected_txin_utxos;
  Amount target_value;
  Amount estimate_fee;


  TransactionApi api;
  auto tx_obj = api.FundRawTransaction(
      txc.GetHex(), utxos, target_value, selected_txin_utxos, address3.GetAddress(),
      effective_fee_rate, &estimate_fee, nullptr, &option, nullptr, NetType::kRegtest);
  EXPECT_EQ(estimate_fee.GetSatoshiValue(), 8360);

  txc = TransactionContext(tx_obj.GetHex());
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "02000000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a473044022029f4ce58206fe107b1dd6cbaf3246391a55cdd639cce10fdf545a8c131e17ebf022022b47d656c8666b188c6b16f9e10f6718bbbd420c390fe7a039f9c4323596d1c01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff03f0187a10f35a00001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac00008d49fd1a070016001445663e592ff613587f0fdd6e74034c5239710dca6806000000000000160014f330ed8383f8afdc977dd88600eb8ff120ba15e40247304402204f83d997acfadec69e45d1719794850ebc3f5bee41057aeefefed8e678e0ed6802206c7653837d7b70343b0dac4f47170b261885c4fcad35b346d0da02d0cc342b7b01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270247304402206089cce85471b83b7afafc4c8363ca10124d831914a27817fa77e27e5a5f5b2e02200cf2c185a1caa93f84ecd25cc4b67cbf04ba3857ca4310688245a53491b9e6f601210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000");
  EXPECT_EQ(txc.GetVsize(), 413);

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(effective_fee_rate);
  EXPECT_EQ(minimum_fee, 8260);
}